

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSubstitutionTree.hpp
# Opt level: O0

IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
* __thiscall
Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
getResultIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>
          (LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this,Literal *lit
          ,bool complementary,bool retrieveSubstitutions,AbstractingUnifier *args,
          AbstractionOracle args_1,bool args_2)

{
  ulong uVar1;
  bool bVar2;
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *in_RSI;
  IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::BinaryResolutionConf::Lhs>_>_>_>_>_>_>_>_>
  *in_RDI;
  anon_class_48_6_5ce745bf iter;
  SubstitutionTree *tree;
  undefined1 local_70 [7];
  Literal *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa1;
  undefined1 local_20 [32];
  
  uVar1 = (ulong)_local_70 >> 0x38;
  _local_70 = getTree((LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)
                      CONCAT71(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98,SUB81(uVar1,0));
  bVar2 = SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::isEmpty(in_RSI);
  Lib::
  ifElseIter<bool,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::getResultIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>(Kernel::Literal*,bool,bool,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool)::_lambda()_1_,Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::getResultIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool>(Kernel::Literal*,bool,bool,Kernel::AbstractingUnifier*,Kernel::AbstractionOracle,bool)::_lambda()_2_>
            (in_RDI,bVar2,local_20,local_70);
  return in_RDI;
}

Assistant:

auto getResultIterator(Literal* lit, bool complementary, bool retrieveSubstitutions, Args... args)
  {
    auto tree = &getTree(lit, complementary);

    auto iter = [tree, lit, retrieveSubstitutions, &args...](bool reversed) 
      { return tree->template iterator<Iterator>(lit, retrieveSubstitutions, reversed, args...); };

    return ifElseIter(
        tree->isEmpty(), [&]() { return VirtualIterator<ELEMENT_TYPE(Iterator)>::getEmpty(); },
                         [&]() { return ifElseIter(!lit->isEquality(),
                                 [&]() { return iter(/* reverse */ false); },
                                 [&]() { return concatIters(iter(/* reverse */ false), iter(/* reverse */ true)); }); }
        );
  }